

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall Am_Connection_Data::Am_Connection_Data(Am_Connection_Data *this)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e3450;
  Am_Value_List::Am_Value_List(&this->Value_Queue);
  (this->my_receiver).from_wrapper = (Am_Method_Wrapper *)0x0;
  (this->my_receiver).Call = (Am_Receive_Method_Type *)0x0;
  *(undefined4 *)&(this->super_Am_Wrapper).field_0xc = 1;
  this->connected = false;
  this->waiting = false;
  Am_Value_List::Make_Empty(&this->Value_Queue);
  this->List_Queue = (Incomplete_List_Ptr)0x0;
  this->Object_Queue = (Incomplete_Object_Ptr)0x0;
  return;
}

Assistant:

Am_Connection_Data::Am_Connection_Data(void)
{
  m_socket = 1;             // Stdout on unix, shouldn't be used anyway
  connected = false;        // Connection flag: Am I Connected?
  waiting = false;          // Am I waiting to accept an incoming conn?
  Value_Queue.Make_Empty(); // Processed incoming data (None yet)
  List_Queue = nullptr;        // Lists being read in
  Object_Queue = nullptr;      // Objects being read in
}